

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O3

EncodingResult<kj::String> * __thiscall
kj::decodeUtf16(EncodingResult<kj::String> *__return_storage_ptr__,kj *this,
               ArrayPtr<const_char16_t> utf16)

{
  char16_t *pcVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  byte *pbVar5;
  char16_t *pcVar6;
  byte bVar7;
  int iVar8;
  char16_t *pcVar9;
  size_t sVar10;
  byte *pbVar11;
  ulong uVar12;
  bool bVar13;
  ulong uVar14;
  Vector<char> local_68;
  EncodingResult<kj::String> *local_40;
  ulong local_38;
  
  pcVar6 = utf16.ptr;
  bVar13 = false;
  uVar12 = 0;
  local_68.builder.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (1,0,(long)pcVar6 + 1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0
                         );
  local_68.builder.endPtr = (char *)((byte *)local_68.builder.ptr + (long)pcVar6 + 1);
  local_68.builder.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_68.builder.pos = local_68.builder.ptr;
  if (pcVar6 != (char16_t *)0x0) {
    uVar14 = 0;
    pcVar9 = (char16_t *)0x0;
    local_40 = __return_storage_ptr__;
    do {
      pcVar1 = (char16_t *)((long)pcVar9 + 1);
      uVar2 = *(ushort *)(this + (long)pcVar9 * 2);
      bVar7 = (byte)uVar2;
      if (uVar2 < 0x80) {
        if (local_68.builder.pos == local_68.builder.endPtr) {
          sVar10 = ((long)local_68.builder.pos - (long)local_68.builder.ptr) * 2;
          if (local_68.builder.pos == local_68.builder.ptr) {
            sVar10 = 4;
          }
          Vector<char>::setCapacity(&local_68,sVar10);
        }
        *local_68.builder.pos = bVar7;
        local_68.builder.pos = local_68.builder.pos + 1;
        pcVar9 = pcVar1;
      }
      else if (uVar2 < 0x800) {
        pbVar5 = (byte *)(local_68.builder.pos + (2 - (long)local_68.builder.ptr));
        if (local_68.builder.endPtr + -(long)local_68.builder.ptr < pbVar5) {
          pbVar11 = (byte *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) * 2);
          if (local_68.builder.endPtr == local_68.builder.ptr) {
            pbVar11 = (byte *)0x4;
          }
          if (pbVar11 < pbVar5) {
            pbVar11 = pbVar5;
          }
          Vector<char>::setCapacity(&local_68,(size_t)pbVar11);
        }
        *local_68.builder.pos = (byte)(uVar2 >> 6) | 0xc0;
        ((byte *)local_68.builder.pos)[1] = bVar7 & 0x3f | 0x80;
        local_68.builder.pos = (RemoveConst<char> *)((byte *)local_68.builder.pos + 2);
        pcVar9 = pcVar1;
      }
      else {
        if ((uVar2 & 0xf800) == 0xd800) {
          uVar12 = CONCAT71((int7)(uVar12 >> 8),1);
          if ((pcVar1 != pcVar6) && ((uVar2 & 0x400) == 0)) {
            uVar3 = *(ushort *)(this + (long)pcVar9 * 2 + 2);
            local_38 = uVar14;
            if ((uVar3 & 0xfc00) == 0xdc00) {
              pbVar5 = (byte *)(local_68.builder.pos + (4 - (long)local_68.builder.ptr));
              if (local_68.builder.endPtr + -(long)local_68.builder.ptr < pbVar5) {
                pbVar11 = (byte *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) * 2
                                  );
                if (local_68.builder.endPtr == local_68.builder.ptr) {
                  pbVar11 = (byte *)0x4;
                }
                if (pbVar11 < pbVar5) {
                  pbVar11 = pbVar5;
                }
                Vector<char>::setCapacity(&local_68,(size_t)pbVar11);
              }
              iVar8 = (uVar2 & 0x3ff) * 0x400;
              uVar4 = (uVar3 & 0x3ff) + iVar8 + 0x10000;
              *local_68.builder.pos = (byte)(uVar4 >> 0x12) | 0xf0;
              ((byte *)local_68.builder.pos)[1] = (byte)(uVar4 >> 0xc) & 0x3f | 0x80;
              ((byte *)local_68.builder.pos)[2] = (byte)(iVar8 + (uVar3 & 0x3ff) >> 6) & 0x3f | 0x80
              ;
              ((byte *)local_68.builder.pos)[3] = (byte)uVar3 & 0x3f | 0x80;
              local_68.builder.pos = (RemoveConst<char> *)((byte *)local_68.builder.pos + 4);
              pcVar9 = pcVar9 + 1;
              uVar14 = local_38;
              goto LAB_00205bab;
            }
          }
        }
        else {
          uVar12 = uVar14 & 0xffffffff;
        }
        pbVar5 = (byte *)(local_68.builder.pos + (3 - (long)local_68.builder.ptr));
        if (local_68.builder.endPtr + -(long)local_68.builder.ptr < pbVar5) {
          pbVar11 = (byte *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) * 2);
          if (local_68.builder.endPtr == local_68.builder.ptr) {
            pbVar11 = (byte *)0x4;
          }
          if (pbVar11 < pbVar5) {
            pbVar11 = pbVar5;
          }
          Vector<char>::setCapacity(&local_68,(size_t)pbVar11);
          uVar12 = uVar12 & 0xffffffff;
        }
        *local_68.builder.pos = (byte)(uVar2 >> 0xc) | 0xe0;
        ((byte *)local_68.builder.pos)[1] = (byte)(uVar2 >> 6) & 0x3f | 0x80;
        ((byte *)local_68.builder.pos)[2] = bVar7 & 0x3f | 0x80;
        local_68.builder.pos = (RemoveConst<char> *)((byte *)local_68.builder.pos + 3);
        uVar14 = uVar12 & 0xffffffff;
        pcVar9 = pcVar1;
      }
LAB_00205bab:
    } while (pcVar9 < pcVar6);
    bVar13 = (bool)((byte)uVar14 & 1);
    __return_storage_ptr__ = local_40;
  }
  if (local_68.builder.pos == local_68.builder.endPtr) {
    sVar10 = 4;
    if (local_68.builder.endPtr != local_68.builder.ptr) {
      sVar10 = ((long)local_68.builder.endPtr - (long)local_68.builder.ptr) * 2;
    }
    Vector<char>::setCapacity(&local_68,sVar10);
  }
  *local_68.builder.pos = 0;
  local_68.builder.pos = local_68.builder.pos + 1;
  if (local_68.builder.pos != local_68.builder.endPtr) {
    Vector<char>::setCapacity(&local_68,(long)local_68.builder.pos - (long)local_68.builder.ptr);
  }
  (__return_storage_ptr__->super_String).content.ptr = local_68.builder.ptr;
  (__return_storage_ptr__->super_String).content.size_ =
       (long)local_68.builder.pos - (long)local_68.builder.ptr;
  (__return_storage_ptr__->super_String).content.disposer = local_68.builder.disposer;
  __return_storage_ptr__->hadErrors = bVar13;
  return __return_storage_ptr__;
}

Assistant:

EncodingResult<String> decodeUtf16(ArrayPtr<const char16_t> utf16) {
  Vector<char> result(utf16.size() + 1);
  bool hadErrors = false;

  size_t i = 0;
  while (i < utf16.size()) {
    char16_t u = utf16[i++];

    if (u < 0x80) {
      result.add(u);
      continue;
    } else if (u < 0x0800) {
      result.addAll<std::initializer_list<char>>({
        static_cast<char>(((u >>  6)       ) | 0xc0),
        static_cast<char>(((u      ) & 0x3f) | 0x80)
      });
      continue;
    } else if ((u & 0xf800) == 0xd800) {
      // surrogate pair
      char16_t u2;
      if (KJ_UNLIKELY(i == utf16.size()                         // missing second half
                   || (u & 0x0400) != 0                         // first half in wrong range
                   || ((u2 = utf16[i]) & 0xfc00) != 0xdc00)) {  // second half in wrong range
        hadErrors = true;
        goto threeByte;
      }
      ++i;

      char32_t u32 = (((u & 0x03ff) << 10) | (u2 & 0x03ff)) + 0x10000;
      result.addAll<std::initializer_list<char>>({
        static_cast<char>(((u32 >> 18)       ) | 0xf0),
        static_cast<char>(((u32 >> 12) & 0x3f) | 0x80),
        static_cast<char>(((u32 >>  6) & 0x3f) | 0x80),
        static_cast<char>(((u32      ) & 0x3f) | 0x80)
      });
      continue;
    } else {
    threeByte:
      result.addAll<std::initializer_list<char>>({
        static_cast<char>(((u >> 12)       ) | 0xe0),
        static_cast<char>(((u >>  6) & 0x3f) | 0x80),
        static_cast<char>(((u      ) & 0x3f) | 0x80)
      });
      continue;
    }
  }

  result.add(0);
  return { String(result.releaseAsArray()), hadErrors };
}